

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

Object * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Object>(Allocator *this,Object *ast)

{
  size_t *psVar1;
  Object *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (Object *)operator_new(0xb8);
  Object::Object(this_00,ast);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }